

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

_Bool ws_contains_word(char *phrase,char *word)

{
  int iVar1;
  size_t n;
  bool bVar2;
  size_t len;
  char *word_local;
  char *phrase_local;
  
  n = strlen(word);
  word_local = phrase;
  while( true ) {
    bVar2 = false;
    if (word_local != (char *)0x0) {
      bVar2 = *word_local != '\0';
    }
    if (!bVar2) break;
    iVar1 = nni_strncasecmp(word_local,word,n);
    if ((iVar1 == 0) &&
       (((word_local[n] == '\0' || (word_local[n] == ' ')) || (word_local[n] == ',')))) {
      return true;
    }
    word_local = strchr(word_local,0x20);
    if (word_local != (char *)0x0) {
      while( true ) {
        bVar2 = true;
        if (*word_local != ' ') {
          bVar2 = *word_local == ',';
        }
        if (!bVar2) break;
        word_local = word_local + 1;
      }
    }
  }
  return false;
}

Assistant:

static bool
ws_contains_word(const char *phrase, const char *word)
{
	size_t len = strlen(word);

	while ((phrase != NULL) && (*phrase != '\0')) {
		if ((nni_strncasecmp(phrase, word, len) == 0) &&
		    ((phrase[len] == 0) || (phrase[len] == ' ') ||
		        (phrase[len] == ','))) {
			return (true);
		}
		// Skip to next word.
		if ((phrase = strchr(phrase, ' ')) != NULL) {
			while ((*phrase == ' ') || (*phrase == ',')) {
				phrase++;
			}
		}
	}
	return (false);
}